

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase252::run(TestCase252 *this)

{
  Reader copyFrom;
  Reader reader;
  ArrayPtr<const_unsigned_int> value;
  initializer_list<unsigned_int> expected;
  Orphanage local_2d0;
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> orphan;
  Builder root2;
  Reader local_270;
  Reader local_240;
  Builder root1;
  MallocMessageBuilder builder2;
  MallocMessageBuilder builder1;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder1,0x400,GROW_HEURISTICALLY);
  MallocMessageBuilder::MallocMessageBuilder(&builder2,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root1,&builder1.super_MessageBuilder);
  root2._builder.segment = (SegmentBuilder *)0x220000000c;
  root2._builder.capTable._0_4_ = 0x38;
  value.size_ = 3;
  value.ptr = (uint *)&root2;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt32List(&root1,value);
  local_2d0 = MessageBuilder::getOrphanage(&builder2.super_MessageBuilder);
  StructBuilder::asReader(&root1._builder);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32List(&local_240,(Reader *)&root2);
  copyFrom.reader.capTable = local_240.reader.capTable;
  copyFrom.reader.segment = local_240.reader.segment;
  copyFrom.reader.ptr = local_240.reader.ptr;
  copyFrom.reader.elementCount = local_240.reader.elementCount;
  copyFrom.reader.step = local_240.reader.step;
  copyFrom.reader.structDataSize = local_240.reader.structDataSize;
  copyFrom.reader.structPointerCount = local_240.reader.structPointerCount;
  copyFrom.reader.elementSize = local_240.reader.elementSize;
  copyFrom.reader._39_1_ = local_240.reader._39_1_;
  copyFrom.reader.nestingLimit = local_240.reader.nestingLimit;
  copyFrom.reader._44_4_ = local_240.reader._44_4_;
  Orphanage::newOrphanCopy<capnp::List<unsigned_int,(capnp::Kind)0>::Reader>
            (&orphan,&local_2d0,copyFrom);
  OrphanGetImpl<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::applyReader
            (&local_270,&orphan.builder);
  root2._builder.segment = (SegmentBuilder *)0x220000000c;
  root2._builder.capTable._0_4_ = 0x38;
  reader.reader.capTable = local_270.reader.capTable;
  reader.reader.segment = local_270.reader.segment;
  reader.reader.ptr = local_270.reader.ptr;
  reader.reader.elementCount = local_270.reader.elementCount;
  reader.reader.step = local_270.reader.step;
  reader.reader.structDataSize = local_270.reader.structDataSize;
  reader.reader.structPointerCount = local_270.reader.structPointerCount;
  reader.reader.elementSize = local_270.reader.elementSize;
  reader.reader._39_1_ = local_270.reader._39_1_;
  reader.reader.nestingLimit = local_270.reader.nestingLimit;
  reader.reader._44_4_ = local_270.reader._44_4_;
  expected._M_len = 3;
  expected._M_array = (iterator)&root2;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
            (reader,expected);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root2,&builder2.super_MessageBuilder);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptUInt32List(&root2,&orphan);
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&builder2);
  MallocMessageBuilder::~MallocMessageBuilder(&builder1);
  return;
}

Assistant:

TEST(Orphans, OrphanageListCopy) {
  MallocMessageBuilder builder1;
  MallocMessageBuilder builder2;

  auto root1 = builder1.initRoot<TestAllTypes>();
  root1.setUInt32List({12, 34, 56});

  Orphan<List<uint32_t>> orphan = builder2.getOrphanage().newOrphanCopy(
      root1.asReader().getUInt32List());
  checkList(orphan.getReader(), {12u, 34u, 56u});

  auto root2 = builder2.initRoot<TestAllTypes>();
  root2.adoptUInt32List(kj::mv(orphan));
}